

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O1

size_t onmt::unicode::utf8len(string *str)

{
  char *pcVar1;
  code_point_t cVar2;
  size_t sVar3;
  size_t sVar4;
  char *str_00;
  size_t char_size;
  size_t local_20;
  
  str_00 = (str->_M_dataplus)._M_p;
  if (*str_00 == '\0') {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    do {
      local_20 = 0;
      cVar2 = utf8_to_cp(str_00,&local_20);
      sVar3 = 1;
      if (cVar2 != 0) {
        sVar3 = local_20;
      }
      sVar4 = sVar4 + (cVar2 != 0);
      pcVar1 = str_00 + sVar3;
      str_00 = str_00 + sVar3;
    } while (*pcVar1 != '\0');
  }
  return sVar4;
}

Assistant:

bool is_mark(code_point_t u)
    {
      return get_char_type(u) == CharType::Mark;
    }